

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::~OcclusionQueryTestInstance
          (OcclusionQueryTestInstance *this)

{
  StateObjects *this_00;
  bool bVar1;
  DeviceInterface *pDVar2;
  DeviceInterface *vk;
  VkDevice local_18;
  VkDevice device;
  OcclusionQueryTestInstance *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__OcclusionQueryTestInstance_016ace28;
  device = (VkDevice)this;
  local_18 = Context::getDevice((this->super_TestInstance).m_context);
  if ((this->m_stateObjects != (StateObjects *)0x0) &&
     (this_00 = this->m_stateObjects, this_00 != (StateObjects *)0x0)) {
    StateObjects::~StateObjects(this_00);
    operator_delete(this_00,0x100);
  }
  ::vk::Handle<(vk::HandleType)11>::Handle((Handle<(vk::HandleType)11> *)&vk,0);
  bVar1 = ::vk::Handle<(vk::HandleType)11>::operator!=
                    (&this->m_queryPool,(Handle<(vk::HandleType)11> *)&vk);
  if (bVar1) {
    pDVar2 = Context::getDeviceInterface((this->super_TestInstance).m_context);
    (*pDVar2->_vptr_DeviceInterface[0x1f])(pDVar2,local_18,(this->m_queryPool).m_internal,0);
  }
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&this->m_copyResultsCommandBuffer);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&this->m_renderCommandBuffer);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&this->m_queryPoolResetCommandBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&this->m_commandPool);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&this->m_queryPoolResultsBuffer);
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

OcclusionQueryTestInstance::~OcclusionQueryTestInstance (void)
{
	const vk::VkDevice device = m_context.getDevice();

	if (m_stateObjects)
		delete m_stateObjects;

	if (m_queryPool != DE_NULL)
	{
		const vk::DeviceInterface& vk = m_context.getDeviceInterface();
		vk.destroyQueryPool(device, m_queryPool, /*pAllocator*/ DE_NULL);
	}
}